

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::AtomicCounterIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,AtomicCounterIndexingCaseInstance *this)

{
  allocator<int> *this_00;
  allocator<unsigned_int> *this_01;
  undefined1 *this_02;
  ShaderType shaderType;
  uint x;
  ShaderSpec *shaderSpec;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  uint *__first;
  bool bVar1;
  const_reference cVar2;
  qpTestResult qVar3;
  deBool dVar4;
  DeviceInterface *vk;
  VkDevice device_00;
  void *ptr;
  const_reference pvVar5;
  Handle<(vk::HandleType)21> *pHVar6;
  Handle<(vk::HandleType)22> *pHVar7;
  Buffer *this_03;
  size_type sVar8;
  reference pvVar9;
  Handle<(vk::HandleType)19> *pHVar10;
  ShaderExecutor *pSVar11;
  reference ppvVar12;
  TestContext *this_04;
  uint *__last;
  reference pvVar13;
  MessageBuilder *pMVar14;
  reference pvVar15;
  InternalError *this_05;
  Context *pCVar16;
  reference rVar17;
  iterator iVar18;
  Buffer *in_stack_fffffffffffff558;
  undefined8 in_stack_fffffffffffff560;
  byte local_a11;
  byte local_9f9;
  reference local_970;
  _Bit_iterator_base local_8d8;
  _Bit_type *local_8c8;
  uint local_8c0;
  _Bit_iterator local_8b8;
  undefined1 local_8a8 [8];
  const_iterator i;
  undefined1 auStack_890 [4];
  int counterNdx_3;
  _Bit_type local_888;
  allocator<char> local_879;
  string local_878;
  TestStatus local_858;
  MessageBuilder local_830;
  byte local_6a9;
  undefined1 auStack_6a8 [7];
  bool isOk;
  _Bit_type local_6a0;
  byte local_696;
  byte local_695;
  uint local_694;
  bool notSeen;
  value_type vStack_690;
  bool rangeOk;
  deUint32 resValue;
  int counterNdx_2;
  int opNdx_4;
  int invocationNdx;
  int counterValue;
  int counterNdx_1;
  TestStatus local_658;
  MessageBuilder local_630;
  value_type local_4ac;
  value_type local_4a8;
  deUint32 resCount;
  deUint32 refCount;
  int counterNdx;
  void *mapPtr;
  int opNdx_3;
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  counterMasks;
  undefined1 local_470 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> counterValues;
  undefined1 local_450 [8];
  vector<int,_std::allocator<int>_> numHits;
  string local_430;
  byte local_409;
  TestLog *local_408;
  TestLog *log;
  DefaultDeleter<vkt::shaderexecutor::ShaderExecutor> local_3f1;
  deUint64 local_3f0;
  undefined1 local_3e8 [8];
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  executor;
  int local_3cc;
  reference pvStack_3c8;
  int opNdx_2;
  int local_3bc;
  reference pvStack_3b8;
  int opNdx_1;
  int *dst;
  undefined4 local_3a8;
  int opNdx;
  VkWriteDescriptorSet descriptorWrite_1;
  VkDescriptorBufferInfo bufferInfo_1;
  VkWriteDescriptorSet descriptorWrite;
  VkDescriptorBufferInfo bufferInfo;
  RefData<vk::Handle<(vk::HandleType)22>_> local_2d8;
  undefined1 local_2b8 [8];
  VkDescriptorSetAllocateInfo allocInfo;
  RefData<vk::Handle<(vk::HandleType)21>_> local_270;
  undefined1 local_250 [8];
  VkDescriptorPoolCreateInfo poolInfo;
  VkDescriptorPoolSize poolSizes [2];
  RefData<vk::Handle<(vk::HandleType)19>_> local_1f8;
  undefined1 local_1d8 [8];
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  VkDescriptorSetLayoutBinding bindings [2];
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  local_180;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  *local_170;
  undefined1 local_160 [8];
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  Buffer atomicOpBuffer;
  VkDevice device;
  DeviceInterface *vkd;
  allocator<unsigned_int> local_89;
  undefined1 local_88 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  vector<void_*,_std::allocator<void_*>_> outputs;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  int numOps;
  int numCounters;
  int numInvocations;
  AtomicCounterIndexingCaseInstance *this_local;
  TestStatus *testResult;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::allocator<unsigned_int>::allocator(&local_89);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,0x80,&local_89);
  std::allocator<unsigned_int>::~allocator(&local_89);
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  device_00 = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                                 m_context);
  anon_unknown_0::Buffer::Buffer
            ((Buffer *)
             &indexBuffer.
              super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              .m_data.field_0x8,
             (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,0x20,0x10);
  de::details::
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  ::MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_160);
  OpaqueTypeIndexingTestInstance::checkSupported
            (&this->super_OpaqueTypeIndexingTestInstance,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);
  ptr = anon_unknown_0::Buffer::getHostPtr
                  ((Buffer *)
                   &indexBuffer.
                    super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                    .m_data.field_0x8);
  ::deMemset(ptr,0,0x10);
  anon_unknown_0::Buffer::flush
            ((Buffer *)
             &indexBuffer.
              super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              .m_data.field_0x8);
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
    pCVar16 = (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this->m_opIndices,0);
    createUniformIndexBuffer
              ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)&local_180,pCVar16,4,pvVar5);
    local_170 = de::details::MovePtr::operator_cast_to_PtrData(&local_180,(MovePtr *)pCVar16);
    data._8_8_ = in_stack_fffffffffffff560;
    data.ptr = in_stack_fffffffffffff558;
    de::details::
    MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::operator=((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                 *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                    deleter.m_allocator,data);
    de::details::
    MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::~MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                *)&local_180);
  }
  layoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x700000000;
  local_1d8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
  layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  layoutInfo._4_4_ = 0;
  layoutInfo.pNext._0_4_ = 0;
  layoutInfo.pNext._4_4_ = 2;
  layoutInfo._16_8_ = &layoutInfo.pBindings;
  ::vk::createDescriptorSetLayout
            ((Move<vk::Handle<(vk::HandleType)19>_> *)(poolSizes + 1),vk,device_00,
             (VkDescriptorSetLayoutCreateInfo *)local_1d8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f8,(Move *)(poolSizes + 1));
  data_00.deleter.m_deviceIface = local_1f8.deleter.m_deviceIface;
  data_00.object.m_internal = local_1f8.object.m_internal;
  data_00.deleter.m_device = local_1f8.deleter.m_device;
  data_00.deleter.m_allocator = local_1f8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)(poolSizes + 1));
  poolInfo.pPoolSizes = (VkDescriptorPoolSize *)0x100000007;
  poolSizes[0].type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
  poolSizes[0].descriptorCount = 1;
  local_250._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
  poolInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  poolInfo._4_4_ = 0;
  poolInfo.pNext._0_4_ = 1;
  poolInfo.pNext._4_4_ = 1;
  poolInfo.flags = 2;
  poolInfo._24_8_ = &poolInfo.pPoolSizes;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts,vk,device_00,
             (VkDescriptorPoolCreateInfo *)local_250,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_270,(Move *)&allocInfo.pSetLayouts);
  data_01.deleter.m_deviceIface = local_270.deleter.m_deviceIface;
  data_01.object.m_internal = local_270.object.m_internal;
  data_01.deleter.m_device = local_270.deleter.m_device;
  data_01.deleter.m_allocator = local_270.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
             ,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&allocInfo.pSetLayouts);
  local_2b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocInfo._4_4_ = 0;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)21>_> *)
                      &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                       deleter.m_pool);
  allocInfo.pNext = (void *)pHVar6->m_internal;
  allocInfo.descriptorPool.m_internal._0_4_ = 1;
  allocInfo._24_8_ =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::get
                 ((RefBase<vk::Handle<(vk::HandleType)19>_> *)
                  &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                   deleter.m_allocator);
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferInfo.range,vk,device_00,
             (VkDescriptorSetAllocateInfo *)local_2b8);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2d8,(Move *)&bufferInfo.range);
  data_02.deleter.m_deviceIface = local_2d8.deleter.m_deviceIface;
  data_02.object.m_internal = local_2d8.object.m_internal;
  data_02.deleter.m_device = local_2d8.deleter.m_device;
  data_02.deleter.m_pool.m_internal = local_2d8.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_160,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&bufferInfo.range);
  descriptorWrite.pTexelBufferView =
       (VkBufferView *)
       anon_unknown_0::Buffer::getBuffer
                 ((Buffer *)
                  &indexBuffer.
                   super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                   .m_data.field_0x8);
  bufferInfo.buffer.m_internal = 0;
  bufferInfo.offset = 0xffffffffffffffff;
  bufferInfo_1.range._0_4_ = 0x23;
  descriptorWrite.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  descriptorWrite._4_4_ = 0;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_160);
  descriptorWrite.pNext = (void *)pHVar7->m_internal;
  descriptorWrite.dstSet.m_internal._0_4_ = 0;
  descriptorWrite.dstSet.m_internal._4_4_ = 0;
  descriptorWrite.dstBinding = 1;
  descriptorWrite.dstArrayElement = 7;
  descriptorWrite.descriptorCount = 0;
  descriptorWrite.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  descriptorWrite.pImageInfo = (VkDescriptorImageInfo *)&descriptorWrite.pTexelBufferView;
  descriptorWrite.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
  (*vk->_vptr_DeviceInterface[0x3e])(vk,device_00,1,&bufferInfo_1.range,0,0);
  bVar1 = de::details::UniqueBase::operator_cast_to_bool
                    ((UniqueBase *)
                     &extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                      deleter.m_allocator);
  if (bVar1) {
    this_03 = de::details::
              UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              ::operator->((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                            *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.
                               m_data.deleter.m_allocator);
    descriptorWrite_1.pTexelBufferView = (VkBufferView *)anon_unknown_0::Buffer::getBuffer(this_03);
    bufferInfo_1.buffer.m_internal = 0;
    bufferInfo_1.offset = 0xffffffffffffffff;
    local_3a8 = 0x23;
    descriptorWrite_1.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    descriptorWrite_1._4_4_ = 0;
    pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_160);
    descriptorWrite_1.pNext = (void *)pHVar7->m_internal;
    descriptorWrite_1.dstSet.m_internal._0_4_ = 1;
    descriptorWrite_1.dstSet.m_internal._4_4_ = 0;
    descriptorWrite_1.dstBinding = 1;
    descriptorWrite_1.dstArrayElement = 6;
    descriptorWrite_1.descriptorCount = 0;
    descriptorWrite_1.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    descriptorWrite_1.pImageInfo = (VkDescriptorImageInfo *)&descriptorWrite_1.pTexelBufferView;
    descriptorWrite_1.pBufferInfo = (VkDescriptorBufferInfo *)0x0;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,device_00,1,&local_3a8,0,0);
  }
  if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
      INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
    sVar8 = std::vector<int,_std::allocator<int>_>::size(this->m_opIndices);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)
               &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,sVar8 << 5);
    for (dst._4_4_ = 0; dst._4_4_ < 4; dst._4_4_ = dst._4_4_ + 1) {
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)
                          &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(long)(dst._4_4_ << 5));
      pvStack_3b8 = pvVar9;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this->m_opIndices,(long)dst._4_4_)
      ;
      std::fill<int*,int>(pvVar9,pvVar9 + 0x20,pvVar5);
    }
    for (local_3bc = 0; local_3bc < 4; local_3bc = local_3bc + 1) {
      pvStack_3c8 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)
                               &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,(long)(local_3bc << 5));
      std::vector<void_*,_std::allocator<void_*>_>::push_back
                ((vector<void_*,_std::allocator<void_*>_> *)
                 &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&stack0xfffffffffffffc38);
    }
  }
  for (local_3cc = 0; local_3cc < 4; local_3cc = local_3cc + 1) {
    executor.
    super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    .m_data._8_8_ =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                    (long)(local_3cc << 5));
    std::vector<void_*,_std::allocator<void_*>_>::push_back
              ((vector<void_*,_std::allocator<void_*>_> *)
               &outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (value_type *)
               &executor.
                super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                .m_data.field_0x8);
  }
  pCVar16 = (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context;
  shaderType = (this->super_OpaqueTypeIndexingTestInstance).m_shaderType;
  shaderSpec = (this->super_OpaqueTypeIndexingTestInstance).m_shaderSpec;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)
                       &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                        deleter.m_allocator);
  local_3f0 = pHVar10->m_internal;
  pSVar11 = createExecutor(pCVar16,shaderType,shaderSpec,(VkDescriptorSetLayout)local_3f0);
  de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>::DefaultDeleter(&local_3f1);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::UniquePtr((UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
               *)local_3e8,pSVar11);
  pSVar11 = de::details::
            UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            ::operator->((UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                          *)local_3e8);
  bVar1 = std::vector<void_*,_std::allocator<void_*>_>::empty
                    ((vector<void_*,_std::allocator<void_*>_> *)
                     &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    local_970 = (reference)0x0;
  }
  else {
    local_970 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          ((vector<void_*,_std::allocator<void_*>_> *)
                           &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0);
  }
  ppvVar12 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                       ((vector<void_*,_std::allocator<void_*>_> *)
                        &outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,0);
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_160);
  log = (TestLog *)pHVar7->m_internal;
  (*pSVar11->_vptr_ShaderExecutor[2])(pSVar11,0x20,local_970,ppvVar12,log);
  de::details::
  UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
  ::~UniquePtr((UniquePtr<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                *)local_3e8);
  this_04 = Context::getTestContext
                      ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  local_408 = tcu::TestContext::getLog(this_04);
  local_409 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_430,"Pass",
             (allocator<char> *)
             ((long)&numHits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  tcu::TestStatus::pass(__return_storage_ptr__,&local_430);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&numHits.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  counterValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = (allocator<int> *)
            ((long)&counterValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(this_00);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_450,4,
             (value_type_conflict1 *)
             ((long)&counterValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&counterValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  this_01 = (allocator<unsigned_int> *)
            ((long)&counterMasks.
                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,4,this_01);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&counterMasks.
                     super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&mapPtr + 7));
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
            *)&opNdx_3,4,(allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&mapPtr + 7)
          );
  std::allocator<std::vector<bool,_std::allocator<bool>_>_>::~allocator
            ((allocator<std::vector<bool,_std::allocator<bool>_>_> *)((long)&mapPtr + 7));
  for (mapPtr._0_4_ = 0; (int)mapPtr < 4; mapPtr._0_4_ = (int)mapPtr + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](this->m_opIndices,(long)(int)mapPtr)
    ;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_450,(long)*pvVar5);
    *pvVar9 = *pvVar9 + 1;
  }
  this_02 = &indexBuffer.
             super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
             .m_data.field_0x8;
  _refCount = (uint *)anon_unknown_0::Buffer::getHostPtr((Buffer *)this_02);
  anon_unknown_0::Buffer::invalidate((Buffer *)this_02);
  __first = _refCount;
  __last = _refCount + 4;
  pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,0);
  std::copy<unsigned_int_const*,unsigned_int*>(__first,__last,pvVar13);
  for (resCount = 0; (int)resCount < 4; resCount = resCount + 1) {
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_450,(long)(int)resCount);
    local_4a8 = *pvVar9 << 5;
    pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470,
                         (long)(int)resCount);
    local_4ac = *pvVar13;
    if (local_4a8 != local_4ac) {
      tcu::TestLog::operator<<(&local_630,local_408,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar14 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [23])"ERROR: atomic counter ");
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)&resCount);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [12])0x137ab23);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_4ac);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [12])0x1367f41);
      pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_4a8);
      tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_630);
      qVar3 = tcu::TestStatus::getCode(__return_storage_ptr__);
      if (qVar3 == QP_TEST_RESULT_PASS) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&counterNdx_1,"Invalid atomic counter value",
                   (allocator<char> *)((long)&counterValue + 3));
        tcu::TestStatus::fail(&local_658,(string *)&counterNdx_1);
        tcu::TestStatus::operator=(__return_storage_ptr__,&local_658);
        tcu::TestStatus::~TestStatus(&local_658);
        std::__cxx11::string::~string((string *)&counterNdx_1);
        std::allocator<char>::~allocator((allocator<char> *)((long)&counterValue + 3));
      }
    }
  }
  invocationNdx = 0;
  while( true ) {
    if (3 < invocationNdx) break;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_450,(long)invocationNdx);
    opNdx_4 = *pvVar9 << 5;
    pvVar15 = std::
              vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
              ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                            *)&opNdx_3,(long)invocationNdx);
    std::vector<bool,_std::allocator<bool>_>::resize(pvVar15,(long)opNdx_4,false);
    invocationNdx = invocationNdx + 1;
  }
  for (counterNdx_2 = 0; counterNdx_2 < 0x20; counterNdx_2 = counterNdx_2 + 1) {
    for (resValue = 0; (int)resValue < 4; resValue = resValue + 1) {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->m_opIndices,(long)(int)resValue);
      vStack_690 = *pvVar5;
      pvVar13 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88,
                           (long)(int)(resValue * 0x20 + counterNdx_2));
      x = *pvVar13;
      local_694 = x;
      pvVar15 = std::
                vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              *)&opNdx_3,(long)vStack_690);
      sVar8 = std::vector<bool,_std::allocator<bool>_>::size(pvVar15);
      local_695 = de::inBounds<unsigned_int>(x,0,(uint)sVar8);
      local_9f9 = 0;
      if ((bool)local_695) {
        pvVar15 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)&opNdx_3,(long)vStack_690);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar15,(ulong)local_694);
        _auStack_6a8 = rVar17;
        bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_6a8);
        local_9f9 = bVar1 ^ 0xff;
      }
      local_696 = local_9f9 & 1;
      local_a11 = 0;
      if ((local_695 & 1) != 0) {
        local_a11 = local_696;
      }
      local_6a9 = local_a11;
      if (local_a11 == 0) {
        tcu::TestLog::operator<<(&local_830,local_408,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar14 = tcu::MessageBuilder::operator<<(&local_830,(char (*) [22])"ERROR: at invocation ")
        ;
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&counterNdx_2);
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(char (*) [6])", op ");
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,(int *)&resValue);
        pMVar14 = tcu::MessageBuilder::operator<<
                            (pMVar14,(char (*) [28])": got invalid result value ");
        pMVar14 = tcu::MessageBuilder::operator<<(pMVar14,&local_694);
        tcu::MessageBuilder::operator<<(pMVar14,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_830);
        qVar3 = tcu::TestStatus::getCode(__return_storage_ptr__);
        if (qVar3 == QP_TEST_RESULT_PASS) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_878,"Invalid result value",&local_879);
          tcu::TestStatus::fail(&local_858,&local_878);
          tcu::TestStatus::operator=(__return_storage_ptr__,&local_858);
          tcu::TestStatus::~TestStatus(&local_858);
          std::__cxx11::string::~string((string *)&local_878);
          std::allocator<char>::~allocator(&local_879);
        }
      }
      else {
        pvVar15 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)&opNdx_3,(long)vStack_690);
        rVar17 = std::vector<bool,_std::allocator<bool>_>::operator[](pvVar15,(ulong)local_694);
        _auStack_890 = rVar17;
        std::_Bit_reference::operator=((_Bit_reference *)auStack_890,true);
      }
    }
  }
  qVar3 = tcu::TestStatus::getCode(__return_storage_ptr__);
  if (qVar3 == QP_TEST_RESULT_PASS) {
    for (i.super__Bit_iterator_base._12_4_ = 0; (int)i.super__Bit_iterator_base._12_4_ < 4;
        i.super__Bit_iterator_base._12_4_ = i.super__Bit_iterator_base._12_4_ + 1) {
      pvVar15 = std::
                vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                              *)&opNdx_3,(long)(int)i.super__Bit_iterator_base._12_4_);
      iVar18 = std::vector<bool,_std::allocator<bool>_>::begin(pvVar15);
      local_8c8 = iVar18.super__Bit_iterator_base._M_p;
      local_8c0 = iVar18.super__Bit_iterator_base._M_offset;
      local_8b8.super__Bit_iterator_base._M_p = local_8c8;
      local_8b8.super__Bit_iterator_base._M_offset = local_8c0;
      std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_8a8,&local_8b8);
      while( true ) {
        pvVar15 = std::
                  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                *)&opNdx_3,(long)(int)i.super__Bit_iterator_base._12_4_);
        iVar18 = std::vector<bool,_std::allocator<bool>_>::end(pvVar15);
        local_8d8._M_p = iVar18.super__Bit_iterator_base._M_p;
        local_8d8._M_offset = iVar18.super__Bit_iterator_base._M_offset;
        bVar1 = std::operator!=((_Bit_iterator_base *)local_8a8,&local_8d8);
        if (!bVar1) break;
        do {
          dVar4 = ::deGetFalse();
          if (dVar4 != 0) {
LAB_01161eb9:
            this_05 = (InternalError *)__cxa_allocate_exception(0x38);
            tcu::InternalError::InternalError
                      (this_05,(char *)0x0,"*i",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderexecutor/vktOpaqueTypeIndexingTests.cpp"
                       ,0x716);
            __cxa_throw(this_05,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
          }
          cVar2 = std::_Bit_const_iterator::operator*((_Bit_const_iterator *)local_8a8);
          if (!cVar2) goto LAB_01161eb9;
          dVar4 = ::deGetFalse();
        } while (dVar4 != 0);
        std::_Bit_const_iterator::operator++((_Bit_const_iterator *)local_8a8,0);
      }
    }
  }
  local_409 = 1;
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             *)&opNdx_3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_470);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_450);
  if ((local_409 & 1) == 0) {
    tcu::TestStatus::~TestStatus(__return_storage_ptr__);
  }
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)22>_> *)local_160);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)21>_> *)
             &extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool
            );
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)19>_> *)
             &extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  de::details::
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  ::~MovePtr((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              *)&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.
                 m_allocator);
  anon_unknown_0::Buffer::~Buffer
            ((Buffer *)
             &indexBuffer.
              super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
              .m_data.field_0x8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_88);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<void_*,_std::allocator<void_*>_>::~vector
            ((vector<void_*,_std::allocator<void_*>_> *)
             &outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)
             &inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus AtomicCounterIndexingCaseInstance::iterate (void)
{
	// \todo [2015-12-02 elecro] Add vertexPipelineStoresAndAtomics feature check.
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numCounters			= NUM_COUNTERS;
	const int					numOps				= NUM_OPS;
	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	std::vector<deUint32>		outValues			(numInvocations*numOps);

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	Buffer						atomicOpBuffer		(m_context, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT, sizeof(deUint32)*numCounters);
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER);

	deMemset(atomicOpBuffer.getHostPtr(), 0, sizeof(deUint32)*numCounters);
	atomicOpBuffer.flush();

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numOps, &m_opIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,	VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ 1u,	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,	1u,	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,	}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		const VkDescriptorBufferInfo	bufferInfo			=
		{
			atomicOpBuffer.getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			1u,		// dstBinding
			0u,		// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_opIndices.size());

		for (int opNdx = 0; opNdx < numOps; opNdx++)
		{
			int* dst = &expandedIndices[numInvocations*opNdx];
			std::fill(dst, dst+numInvocations, m_opIndices[opNdx]);
		}

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			inputs.push_back(&expandedIndices[opNdx*numInvocations]);
	}

	for (int opNdx = 0; opNdx < numOps; opNdx++)
		outputs.push_back(&outValues[opNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	{
		tcu::TestLog&					log				= m_context.getTestContext().getLog();
		tcu::TestStatus					testResult		= tcu::TestStatus::pass("Pass");
		std::vector<int>				numHits			(numCounters, 0);	// Number of hits per counter.
		std::vector<deUint32>			counterValues	(numCounters);
		std::vector<std::vector<bool> >	counterMasks	(numCounters);

		for (int opNdx = 0; opNdx < numOps; opNdx++)
			numHits[m_opIndices[opNdx]] += 1;

		// Read counter values
		{
			const void* mapPtr = atomicOpBuffer.getHostPtr();
			DE_ASSERT(mapPtr != DE_NULL);
			atomicOpBuffer.invalidate();
			std::copy((const deUint32*)mapPtr, (const deUint32*)mapPtr + numCounters, &counterValues[0]);
		}

		// Verify counter values
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const deUint32		refCount	= (deUint32)(numHits[counterNdx]*numInvocations);
			const deUint32		resCount	= counterValues[counterNdx];

			if (refCount != resCount)
			{
				log << tcu::TestLog::Message << "ERROR: atomic counter " << counterNdx << " has value " << resCount
					<< ", expected " << refCount
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid atomic counter value");
			}
		}

		// Allocate bitmasks - one bit per each valid result value
		for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
		{
			const int	counterValue	= numHits[counterNdx]*numInvocations;
			counterMasks[counterNdx].resize(counterValue, false);
		}

		// Verify result values from shaders
		for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
		{
			for (int opNdx = 0; opNdx < numOps; opNdx++)
			{
				const int		counterNdx	= m_opIndices[opNdx];
				const deUint32	resValue	= outValues[opNdx*numInvocations + invocationNdx];
				const bool		rangeOk		= de::inBounds(resValue, 0u, (deUint32)counterMasks[counterNdx].size());
				const bool		notSeen		= rangeOk && !counterMasks[counterNdx][resValue];
				const bool		isOk		= rangeOk && notSeen;

				if (!isOk)
				{
					log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
						<< ", op " << opNdx << ": got invalid result value "
						<< resValue
						<< tcu::TestLog::EndMessage;

					if (testResult.getCode() == QP_TEST_RESULT_PASS)
						testResult = tcu::TestStatus::fail("Invalid result value");
				}
				else
				{
					// Mark as used - no other invocation should see this value from same counter.
					counterMasks[counterNdx][resValue] = true;
				}
			}
		}

		if (testResult.getCode() == QP_TEST_RESULT_PASS)
		{
			// Consistency check - all masks should be 1 now
			for (int counterNdx = 0; counterNdx < numCounters; counterNdx++)
			{
				for (std::vector<bool>::const_iterator i = counterMasks[counterNdx].begin(); i != counterMasks[counterNdx].end(); i++)
					TCU_CHECK_INTERNAL(*i);
			}
		}

		return testResult;
	}
}